

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finalize.c
# Opt level: O3

void run_in_store(wasm_store_t *store)

{
  FILE *__stream;
  size_t sVar1;
  long lVar2;
  long lVar3;
  char *__s;
  ulong uVar4;
  wasm_byte_vec_t binary;
  wasm_extern_vec_t imports;
  undefined1 auStack_58 [8];
  void *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  puts("Loading binary...");
  __stream = fopen("finalize.wasm","rb");
  if (__stream == (FILE *)0x0) {
LAB_0010143a:
    __s = "> Error loading module!";
  }
  else {
    fseek(__stream,0,2);
    sVar1 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(auStack_58,sVar1);
    sVar1 = fread(local_50,sVar1,1,__stream);
    if (sVar1 != 1) goto LAB_0010143a;
    fclose(__stream);
    puts("Compiling module...");
    lVar2 = wasm_module_new(store,auStack_58);
    if (lVar2 != 0) {
      wasm_byte_vec_delete(auStack_58);
      puts("Instantiating modules...");
      uVar4 = 0;
      while( true ) {
        if ((int)((uVar4 & 0xffffffff) / 10000) * -10000 + (int)uVar4 == 0) {
          printf("%d\n",uVar4 & 0xffffffff);
        }
        local_48 = 0;
        uStack_40 = 0;
        lVar3 = wasm_instance_new(store,lVar2,&local_48,0);
        if (lVar3 == 0) break;
        wasm_instance_set_host_info_with_finalizer(lVar3,uVar4,finalize);
        wasm_instance_delete(lVar3);
        live_count = live_count + 1;
        uVar4 = uVar4 + 1;
        if (uVar4 == 0x186a1) {
          wasm_module_delete(lVar2);
          return;
        }
      }
      printf("> Error instantiating module %d!\n",uVar4 & 0xffffffff);
      goto LAB_00101430;
    }
    __s = "> Error compiling module!";
  }
  puts(__s);
LAB_00101430:
  exit(1);
}

Assistant:

void run_in_store(wasm_store_t* store) {
  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("finalize.wasm", "rb");
  if (!file) {
    printf("> Error loading module!\n");
    exit(1);
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    exit(1);
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    exit(1);
  }

  wasm_byte_vec_delete(&binary);

  // Instantiate.
  printf("Instantiating modules...\n");
  for (int i = 0; i <= iterations; ++i) {
    if (i % (iterations / 10) == 0) printf("%d\n", i);
    wasm_extern_vec_t imports = WASM_EMPTY_VEC;
    own wasm_instance_t* instance =
      wasm_instance_new(store, module, &imports, NULL);
    if (!instance) {
      printf("> Error instantiating module %d!\n", i);
      exit(1);
    }
    void* data = (void*)(intptr_t)i;
    wasm_instance_set_host_info_with_finalizer(instance, data, &finalize);
    wasm_instance_delete(instance);
    ++live_count;
  }

  wasm_module_delete(module);
}